

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

shared_ptr<duckdb::RowGroupCollection,_true> __thiscall
duckdb::RowGroupCollection::AlterType
          (RowGroupCollection *this,ClientContext *context,idx_t changed_idx,
          LogicalType *target_type,vector<duckdb::StorageIndex,_true> *bound_columns,
          Expression *cast_expr)

{
  reference pvVar1;
  RowGroupCollection *pRVar2;
  reference pvVar3;
  Allocator *allocator;
  ColumnStatistics *this_00;
  type target_type_00;
  pointer this_01;
  BaseStatistics *other;
  RowGroupSegmentTree *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TableStatistics *lock_00;
  idx_t i;
  ulong __n;
  RowGroup *new_collection;
  shared_ptr<duckdb::RowGroupCollection,_true> sVar4;
  Expression *in_stack_00000008;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> new_row_group;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  lock;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> local_2f8;
  reference<RowGroupCollection> local_2f0;
  SegmentIterator __begin1;
  vector<duckdb::LogicalType,_true> scan_types;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_2c0;
  vector<duckdb::LogicalType,_true> new_types;
  SegmentIterationHelper local_290;
  DataChunk scan_chunk;
  ExpressionExecutor executor;
  TableScanState scan_state;
  
  local_2f0._M_data = (RowGroupCollection *)changed_idx;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&new_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &context->registered_state);
  pvVar1 = vector<duckdb::LogicalType,_true>::get<true>
                     ((vector<duckdb::LogicalType,_true> *)
                      &new_types.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                      (size_type)target_type);
  LogicalType::operator=(pvVar1,(LogicalType *)bound_columns);
  scan_state.table_state.row_group =
       (RowGroup *)
       (context->db).internal.
       super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  make_shared_ptr<duckdb::RowGroupCollection,duckdb::shared_ptr<duckdb::DataTableInfo,true>&,duckdb::BlockManager&,duckdb::vector<duckdb::LogicalType,true>,unsigned_long&,unsigned_long,unsigned_long_const&>
            ((shared_ptr<duckdb::DataTableInfo,_true> *)this,
             (BlockManager *)
             &(context->db).internal.
              super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (vector<duckdb::LogicalType,_true> *)
             (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
             super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (unsigned_long *)&new_types,&(context->config).home_directory._M_string_length,
             (unsigned_long *)&scan_state);
  pRVar2 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  TableStatistics::InitializeAlterType
            (&pRVar2->stats,(TableStatistics *)&(context->config).enable_profiler,(idx_t)target_type
             ,(LogicalType *)bound_columns);
  scan_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scan_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  scan_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__n = 0; __n < (ulong)(*(long *)&(cast_expr->super_BaseExpression).type -
                              (long)(cast_expr->super_BaseExpression)._vptr_BaseExpression >> 5);
      __n = __n + 1) {
    pvVar3 = vector<duckdb::StorageIndex,_true>::get<true>
                       ((vector<duckdb::StorageIndex,_true> *)cast_expr,__n);
    if (pvVar3->index == 0xffffffffffffffff) {
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&scan_types,
                 &LogicalType::ROW_TYPE);
    }
    else {
      pvVar3 = vector<duckdb::StorageIndex,_true>::get<true>
                         ((vector<duckdb::StorageIndex,_true> *)cast_expr,__n);
      pvVar1 = vector<duckdb::LogicalType,_true>::get<true>
                         ((vector<duckdb::LogicalType,_true> *)&context->registered_state,
                          pvVar3->index);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&scan_types,
                 pvVar1);
    }
  }
  DataChunk::DataChunk(&scan_chunk);
  allocator = GetAllocator((RowGroupCollection *)context);
  DataChunk::Initialize(&scan_chunk,allocator,&scan_types,0x800);
  ExpressionExecutor::ExpressionExecutor(&executor,(ClientContext *)local_2f0._M_data);
  ExpressionExecutor::AddExpression(&executor,in_stack_00000008);
  TableScanState::TableScanState(&scan_state);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::vector
            (&local_2c0,
             (vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)cast_expr);
  TableScanState::Initialize
            (&scan_state,(vector<duckdb::StorageIndex,_true> *)&local_2c0,
             (optional_ptr<duckdb::ClientContext,_true>)0x0,
             (optional_ptr<duckdb::TableFilterSet,_true>)0x0,
             (optional_ptr<duckdb::SampleOptions,_true>)0x0);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_2c0);
  scan_state.table_state.max_row =
       (long)&(((context->db).internal.
                super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
              super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2> +
       (context->config).home_directory._M_string_length;
  pRVar2 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  lock_00 = &pRVar2->stats;
  TableStatistics::GetLock((TableStatistics *)&lock);
  pRVar2 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>::
  operator*(&lock);
  this_00 = TableStatistics::GetStats
                      (&pRVar2->stats,(TableStatisticsLock *)lock_00,(idx_t)target_type);
  local_290.tree =
       &shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
                  ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)
                   &(context->config).home_directory.field_2)->
        super_SegmentTree<duckdb::RowGroup,_true>;
  __begin1 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::begin(&local_290);
  new_collection = __begin1.current;
  while (new_collection != (RowGroup *)0x0) {
    target_type_00 =
         shared_ptr<duckdb::RowGroupCollection,_true>::operator*
                   ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    RowGroup::AlterType((RowGroup *)&new_row_group,(RowGroupCollection *)new_collection,
                        (LogicalType *)target_type_00,(idx_t)bound_columns,
                        (ExpressionExecutor *)target_type,(CollectionScanState *)&executor,
                        (DataChunk *)&scan_state);
    this_01 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                        (&new_row_group);
    other = ColumnStatistics::Statistics(this_00);
    RowGroup::MergeIntoStatistics(this_01,(idx_t)target_type,other);
    pRVar2 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                       ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    this_02 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&pRVar2->row_groups);
    local_2f8._M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
    super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true>)
         (__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true>)
         new_row_group.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
         _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
         super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
    new_row_group.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
    super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
    super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
         (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
         (__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true>)0x0;
    SegmentTree<duckdb::RowGroup,_true>::AppendSegment
              (&this_02->super_SegmentTree<duckdb::RowGroup,_true>,
               (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               &local_2f8);
    ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
              (&local_2f8);
    ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
              ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)
               &new_row_group);
    SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::Next(&__begin1);
    new_collection = __begin1.current;
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr(&lock.
                 super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
               );
  TableScanState::~TableScanState(&scan_state);
  ExpressionExecutor::~ExpressionExecutor(&executor);
  DataChunk::~DataChunk(&scan_chunk);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&scan_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&new_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  sVar4.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::RowGroupCollection,_true>)
         sVar4.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<RowGroupCollection> RowGroupCollection::AlterType(ClientContext &context, idx_t changed_idx,
                                                             const LogicalType &target_type,
                                                             vector<StorageIndex> bound_columns,
                                                             Expression &cast_expr) {
	D_ASSERT(changed_idx < types.size());
	auto new_types = types;
	new_types[changed_idx] = target_type;

	auto result = make_shared_ptr<RowGroupCollection>(info, block_manager, std::move(new_types), row_start,
	                                                  total_rows.load(), row_group_size);
	result->stats.InitializeAlterType(stats, changed_idx, target_type);

	vector<LogicalType> scan_types;
	for (idx_t i = 0; i < bound_columns.size(); i++) {
		if (bound_columns[i].IsRowIdColumn()) {
			scan_types.emplace_back(LogicalType::ROW_TYPE);
		} else {
			scan_types.push_back(types[bound_columns[i].GetPrimaryIndex()]);
		}
	}
	DataChunk scan_chunk;
	scan_chunk.Initialize(GetAllocator(), scan_types);

	ExpressionExecutor executor(context);
	executor.AddExpression(cast_expr);

	TableScanState scan_state;
	scan_state.Initialize(bound_columns);
	scan_state.table_state.max_row = row_start + total_rows;

	// now alter the type of the column within all of the row_groups individually
	auto lock = result->stats.GetLock();
	auto &changed_stats = result->stats.GetStats(*lock, changed_idx);
	for (auto &current_row_group : row_groups->Segments()) {
		auto new_row_group = current_row_group.AlterType(*result, target_type, changed_idx, executor,
		                                                 scan_state.table_state, scan_chunk);
		new_row_group->MergeIntoStatistics(changed_idx, changed_stats.Statistics());
		result->row_groups->AppendSegment(std::move(new_row_group));
	}
	return result;
}